

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O0

void __thiscall
btBU_Simplex1to4::btBU_Simplex1to4
          (btBU_Simplex1to4 *this,btVector3 *pt0,btVector3 *pt1,btVector3 *pt2)

{
  btBU_Simplex1to4 *pbVar1;
  undefined8 *in_RDI;
  btVector3 *in_stack_ffffffffffffffa8;
  btBU_Simplex1to4 *local_38;
  btPolyhedralConvexAabbCachingShape *in_stack_ffffffffffffffd0;
  
  btPolyhedralConvexAabbCachingShape::btPolyhedralConvexAabbCachingShape(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__btBU_Simplex1to4_002e5a40;
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  pbVar1 = (btBU_Simplex1to4 *)(in_RDI + 0xf);
  do {
    local_38 = pbVar1;
    btVector3::btVector3((btVector3 *)local_38);
    pbVar1 = (btBU_Simplex1to4 *)
             &(local_38->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
              super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_userPointer;
  } while (pbVar1 != (btBU_Simplex1to4 *)(in_RDI + 0x17));
  *(undefined4 *)(in_RDI + 1) = 2;
  addVertex(local_38,in_stack_ffffffffffffffa8);
  addVertex(local_38,in_stack_ffffffffffffffa8);
  addVertex(local_38,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

btBU_Simplex1to4::btBU_Simplex1to4(const btVector3& pt0,const btVector3& pt1,const btVector3& pt2) : btPolyhedralConvexAabbCachingShape (),
m_numVertices(0)
{
	m_shapeType = TETRAHEDRAL_SHAPE_PROXYTYPE;
	addVertex(pt0);
	addVertex(pt1);
	addVertex(pt2);
}